

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_lazy_or_inplace
               (roaring_bitmap_t *x1,roaring_bitmap_t *x2,_Bool bitsetconversion)

{
  byte bVar1;
  container_t *c;
  array_container_t *sc;
  ulong uVar2;
  array_container_t *paVar3;
  byte type;
  int32_t iVar4;
  undefined7 in_register_00000011;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  roaring_array_t *ra;
  bool bVar13;
  uint8_t type1;
  uint8_t type2;
  uint8_t result_type;
  byte local_7f;
  uint8_t local_7e;
  uint8_t local_7d;
  uint16_t local_7c;
  uint16_t local_7a;
  ulong local_78;
  long local_70;
  array_container_t *local_68;
  roaring_array_t *local_60;
  ulong local_58;
  int local_50;
  undefined4 local_4c;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_7d = '\0';
  local_50 = (x2->high_low_container).size;
  if (local_50 == 0) {
    return;
  }
  uVar5 = (x1->high_low_container).size;
  if (uVar5 == 0) {
    ra_overwrite(&x2->high_low_container,&x1->high_low_container,
                 (_Bool)((x2->high_low_container).flags & 1));
    return;
  }
  local_4c = (undefined4)CONCAT71(in_register_00000011,bitsetconversion);
  local_7a = *(x1->high_low_container).keys;
  local_7c = *(x2->high_low_container).keys;
  local_48 = (ulong)(uint)-local_50;
  uVar9 = 0;
  uVar2 = 0;
  local_60 = &x1->high_low_container;
  do {
    local_58 = (ulong)uVar5;
    local_78 = uVar9 & 0xffffffff;
    iVar12 = (int)local_48 + (int)uVar9;
    local_68 = (array_container_t *)(long)(int)uVar9;
    local_70 = (long)local_68 * 8;
    uVar8 = uVar2 & 0xffffffff;
    lVar11 = 0;
    local_38 = uVar9;
    while( true ) {
      ra = local_60;
      uVar9 = local_78 + lVar11;
      iVar10 = (int)lVar11;
      iVar4 = (int32_t)(uVar8 + lVar11);
      if (local_7a == local_7c) break;
      iVar7 = (int)uVar2;
      if (local_7a < local_7c) {
        uVar2 = uVar8 + lVar11 + 1;
        iVar6 = (int)local_58;
        if (iVar6 + iVar10 == (int)uVar2) {
          iVar4 = (int)local_78 + iVar10;
          goto LAB_00115ae8;
        }
        local_7a = local_60->keys[uVar2 & 0xffff];
        uVar9 = (ulong)(uint)((int)local_78 + iVar10);
        goto LAB_00115a53;
      }
      local_7e = (x2->high_low_container).typecodes[uVar9 & 0xffff];
      c = get_copy_of_container
                    ((x2->high_low_container).containers[uVar9 & 0xffff],&local_7e,
                     (_Bool)((x2->high_low_container).flags & 1));
      if (((x2->high_low_container).flags & 1) != 0) {
        if ((x2->high_low_container).size <= (int)uVar9) goto LAB_00115aed;
        *(container_t **)((long)(x2->high_low_container).containers + lVar11 * 8 + local_70) = c;
        ((x2->high_low_container).typecodes + (long)local_68)[lVar11] = local_7e;
      }
      ra_insert_new_key_value_at(local_60,iVar4,local_7c,c,local_7e);
      if (iVar12 + iVar10 != -1) {
        local_7c = (x2->high_low_container).keys[(ushort)((short)local_78 + (short)lVar11 + 1)];
      }
      lVar11 = lVar11 + 1;
      iVar6 = (int)lVar11;
      if (iVar6 + iVar12 == 0) {
        iVar4 = (int)local_38 + iVar6;
        iVar7 = iVar7 + iVar6;
        iVar6 = (int)local_58 + iVar6;
        ra = local_60;
        goto LAB_00115a78;
      }
    }
    uVar2 = uVar8 + lVar11 & 0xffff;
    type = local_60->typecodes[uVar2];
    sc = (array_container_t *)local_60->containers[uVar2];
    paVar3 = sc;
    bVar1 = type;
    local_7f = type;
    if (type == 4) {
      bVar1 = *(byte *)&sc->array;
      if (bVar1 == 4) {
        __assert_fail("*type != SHARED_CONTAINER_TYPE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1062,
                      "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
      }
      paVar3 = *(array_container_t **)sc;
    }
    if (bVar1 == 3) {
      if ((paVar3->cardinality == 1) && (*paVar3->array == 0)) {
        bVar13 = paVar3->array[1] == 0xffff;
        goto LAB_00115866;
      }
LAB_00115871:
      local_40 = uVar8;
      if ((char)local_4c == '\0') {
LAB_0011588c:
        if (type == 4) {
          sc = (array_container_t *)
               shared_container_extract_copy((shared_container_t *)sc,&local_7f);
        }
      }
      else {
        bVar1 = type;
        if (type == 4) {
          bVar1 = *(byte *)&sc->array;
        }
        if (bVar1 == 1) goto LAB_0011588c;
        paVar3 = sc;
        if (type == 4) {
          local_7f = *(byte *)&sc->array;
          if (local_7f == 4) {
            __assert_fail("*type != SHARED_CONTAINER_TYPE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1070,
                          "container_t *container_mutable_unwrap_shared(container_t *, uint8_t *)");
          }
          paVar3 = *(array_container_t **)sc;
        }
        switch(local_7f) {
        case 1:
          local_68 = paVar3;
          goto LAB_00115968;
        case 2:
          local_70 = CONCAT71(local_70._1_7_,type);
          local_68 = (array_container_t *)bitset_container_from_array(paVar3);
          break;
        case 3:
          local_70 = CONCAT71(local_70._1_7_,type);
          local_68 = (array_container_t *)bitset_container_from_run((run_container_t *)paVar3);
          break;
        case 4:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x10ae,"bitset_container_t *container_to_bitset(container_t *, uint8_t)");
        default:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x10b0,"bitset_container_t *container_to_bitset(container_t *, uint8_t)");
        }
        type = (byte)local_70;
LAB_00115968:
        container_free(sc,type);
        local_7f = 1;
        sc = local_68;
      }
      local_7e = (x2->high_low_container).typecodes[uVar9 & 0xffff];
      paVar3 = (array_container_t *)
               container_lazy_ior(sc,local_7f,(x2->high_low_container).containers[uVar9 & 0xffff],
                                  local_7e,&local_7d);
      if (paVar3 != sc) {
        container_free(sc,local_7f);
      }
      if (((roaring_array_t *)&ra->size)->size <= iVar4) {
LAB_00115aed:
        __assert_fail("i < ra->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1a3a,
                      "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                     );
      }
      ra->containers[(int)local_40 + lVar11] = paVar3;
      ra->typecodes[lVar11 + (int)local_40] = local_7d;
      uVar8 = local_40;
    }
    else {
      if ((bVar1 != 2) && (bVar1 != 1)) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1110,"_Bool container_is_full(const container_t *, uint8_t)");
      }
      bVar13 = paVar3->cardinality == 0x10000;
LAB_00115866:
      if (!bVar13) goto LAB_00115871;
    }
    iVar6 = (int)local_58;
    uVar2 = uVar8 + lVar11 + 1;
    uVar9 = local_78 + 1 + lVar11;
    if ((int)local_78 + (int)local_48 + iVar10 == -1 || iVar6 + iVar10 == (uint)uVar2) {
      iVar4 = (int)local_78 + iVar10 + 1;
      iVar7 = (int)uVar8;
LAB_00115ae8:
      iVar7 = iVar7 + iVar10 + 1;
      iVar6 = iVar6 + iVar10;
LAB_00115a78:
      if (iVar7 != iVar6) {
        return;
      }
      ra_append_copy_range
                (ra,&x2->high_low_container,iVar4,local_50,
                 (_Bool)((x2->high_low_container).flags & 1));
      return;
    }
    local_7a = ra->keys[(uint)uVar2 & 0xffff];
    local_7c = (x2->high_low_container).keys[(uint)uVar9 & 0xffff];
LAB_00115a53:
    uVar5 = iVar6 + iVar10;
  } while( true );
}

Assistant:

void roaring_bitmap_lazy_or_inplace(roaring_bitmap_t *x1,
                                    const roaring_bitmap_t *x2,
                                    const bool bitsetconversion) {
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            if (!container_is_full(c1, type1)) {
                if ((bitsetconversion == false) ||
                    (get_container_type(c1, type1) == BITSET_CONTAINER_TYPE)
                ){
                    c1 = get_writable_copy_if_shared(c1, &type1);
                } else {
                    // convert to bitset
                    container_t *old_c1 = c1;
                    uint8_t old_type1 = type1;
                    c1 = container_mutable_unwrap_shared(c1, &type1);
                    c1 = container_to_bitset(c1, type1);
                    container_free(old_c1, old_type1);
                    type1 = BITSET_CONTAINER_TYPE;
                }

                container_t *c2 = ra_get_container_at_index(
                                        &x2->high_low_container, pos2, &type2);
                container_t *c = container_lazy_ior(c1, type1, c2, type2,
                                                    &result_type);

                if (c != c1) {  // in this instance a new container was created,
                                // and we need to free the old one
                    container_free(c1, type1);
                }

                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            // container_t *c2_clone = container_clone(c2, type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}